

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * apply_assign_operation(Value *left_value,Value *right_value,Operator operator)

{
  Value *local_28;
  Value *result_value;
  Operator operator_local;
  Value *right_value_local;
  Value *left_value_local;
  
  switch(operator) {
  case ASSIGN_OP:
    local_28 = right_value;
    break;
  default:
    local_28 = new_null_value();
    break;
  case ASSIGN_ADDITION_OP:
    local_28 = apply_addition_operation(left_value,right_value);
    break;
  case ASSIGN_SUBTRACTION_OP:
    local_28 = apply_subtraction_operation(left_value,right_value);
    break;
  case ASSIGN_MULTIPLICATION_OP:
    local_28 = apply_multiplication_operation(left_value,right_value);
    break;
  case ASSIGN_DIVISION_OP:
    local_28 = apply_division_operation(left_value,right_value,false);
    break;
  case ASSIGN_INTEGER_DIVISION_OP:
    local_28 = apply_division_operation(left_value,right_value,true);
    break;
  case ASSIGN_EXPONENT_OP:
    local_28 = apply_exponent_operation(left_value,right_value);
    break;
  case ASSIGN_MOD_OP:
    local_28 = apply_mod_operation(left_value,right_value);
  }
  return local_28;
}

Assistant:

Value *apply_assign_operation(Value *left_value, Value *right_value, Operator operator) {
  Value *result_value = NULL;

  switch (operator) {
    case ASSIGN_OP: {
      result_value = right_value;
      break;
    }

    case ASSIGN_ADDITION_OP:{
      result_value = apply_addition_operation(left_value, right_value);

      break;
    }

    case ASSIGN_SUBTRACTION_OP:{
      result_value = apply_subtraction_operation(left_value, right_value);
      break;
    }

    case ASSIGN_MULTIPLICATION_OP:{
      result_value = apply_multiplication_operation(left_value, right_value);
      break;
    }

    case ASSIGN_DIVISION_OP:{
      result_value = apply_division_operation(left_value, right_value, false);
      break;
    }

    case ASSIGN_INTEGER_DIVISION_OP:{
      result_value = apply_division_operation(left_value, right_value, true);
      break;
    }

    case ASSIGN_EXPONENT_OP:{
      result_value = apply_exponent_operation(left_value, right_value);
      break;
    }

    case ASSIGN_MOD_OP:{
      result_value = apply_mod_operation(left_value, right_value);
      break;
    }

    default: {
      result_value = new_null_value();
      break;
    }
  }

  return result_value;
}